

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::tls12_add_verify_sigalgs(SSL_HANDSHAKE *hs,CBB *out)

{
  int iVar1;
  iterator puVar2;
  uint16_t sigalg;
  iterator __end1;
  iterator __begin1;
  Span<const_unsigned_short> *local_28;
  Span<const_unsigned_short> *__range1;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  __range1 = (Span<const_unsigned_short> *)out;
  out_local = (CBB *)hs;
  ___begin1 = tls12_get_verify_sigalgs(hs);
  local_28 = (Span<const_unsigned_short> *)&__begin1;
  __end1 = Span<const_unsigned_short>::begin(local_28);
  puVar2 = Span<const_unsigned_short>::end(local_28);
  while( true ) {
    if (__end1 == puVar2) {
      return true;
    }
    iVar1 = CBB_add_u16((CBB *)__range1,*__end1);
    if (iVar1 == 0) break;
    __end1 = __end1 + 1;
  }
  return false;
}

Assistant:

bool tls12_add_verify_sigalgs(const SSL_HANDSHAKE *hs, CBB *out) {
  for (uint16_t sigalg : tls12_get_verify_sigalgs(hs)) {
    if (!CBB_add_u16(out, sigalg)) {
      return false;
    }
  }
  return true;
}